

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O1

void __thiscall
yactfr::internal::JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq>::_validate
          (JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq> *this,JsonVal *jsonVal)

{
  string msg;
  TextLocation loc;
  JsonObjVal *pJVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  _Rb_tree_header *p_Var4;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  char cVar5;
  undefined1 in_stack_fffffffffffffe00 [16];
  ostringstream local_1a0 [376];
  
  JsonObjValReq::_validate(&this->super_JsonObjValReq,jsonVal);
  if (this->_allowEmpty == false) {
    pJVar1 = JsonVal::asObj(jsonVal);
    if ((pJVar1->super_MapItemMixin<yactfr::internal::JsonVal>).
        super_CompoundItemMixin<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>_>
        ._theItems._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Expecting at least one ",0x17);
      poVar3 = std::operator<<((ostream *)local_1a0,this->_propName);
      cVar5 = '.';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&stack0xfffffffffffffdff,1);
      std::__cxx11::stringbuf::str();
      msg.field_2._8_8_ = in_stack_fffffffffffffdf0;
      msg._0_24_ = jsonVal->_loc;
      loc._offset._7_1_ = cVar5;
      loc._offset._0_7_ = in_stack_fffffffffffffdf8;
      loc._lineNumber = in_stack_fffffffffffffe00._0_8_;
      loc._colNumber = in_stack_fffffffffffffe00._8_8_;
      throwTextParseError(msg,loc);
    }
  }
  pJVar1 = JsonVal::asObj(jsonVal);
  p_Var2 = *(_Base_ptr *)
            ((long)&(pJVar1->super_MapItemMixin<yactfr::internal::JsonVal>).
                    super_CompoundItemMixin<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>_>
                    ._theItems._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var4 = &(pJVar1->super_MapItemMixin<yactfr::internal::JsonVal>).
            super_CompoundItemMixin<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>_>
            ._theItems._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    do {
      JsonValReq::validate((JsonValReq *)&this->_rangeSetReq,*(JsonVal **)(p_Var2 + 2));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonObjValReq::_validate(jsonVal);

            if (!_allowEmpty && jsonVal.asObj().size() < 1) {
                std::ostringstream ss;

                ss << "Expecting at least one " << _propName << '.';
                throwTextParseError(ss.str(), jsonVal.loc());
            }

            for (auto& keyJsonValPair : jsonVal.asObj()) {
                try {
                    _rangeSetReq.validate(*keyJsonValPair.second);
                } catch (TextParseError& exc) {
                    std::ostringstream ss;

                    ss << "In " << _propName << " `" << keyJsonValPair.first << "`:";
                    appendMsgToTextParseError(exc, ss.str(), jsonVal.loc());
                    throw;
                }
            }
        } catch (TextParseError& exc) {
            std::ostringstream ss;

            ss << "Invalid " << _objName << ":";
            appendMsgToTextParseError(exc, ss.str(), jsonVal.loc());
            throw;
        }
    }